

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O0

int coda_pcre2_substring_copy_byname_8
              (pcre2_match_data_8 *match_data,PCRE2_SPTR8 stringname,PCRE2_UCHAR8 *buffer,
              size_t *sizeptr)

{
  ushort uVar1;
  int iVar2;
  uint32_t n;
  int entrysize;
  int failrc;
  PCRE2_SPTR8 entry;
  PCRE2_SPTR8 last;
  PCRE2_SPTR8 first;
  size_t *sizeptr_local;
  PCRE2_UCHAR8 *buffer_local;
  PCRE2_SPTR8 stringname_local;
  pcre2_match_data_8 *match_data_local;
  
  if (match_data->matchedby == '\x01') {
    match_data_local._4_4_ = 0xffffffd7;
  }
  else {
    first = (PCRE2_SPTR8)sizeptr;
    sizeptr_local = (size_t *)buffer;
    buffer_local = stringname;
    stringname_local = (PCRE2_SPTR8)match_data;
    match_data_local._4_4_ =
         coda_pcre2_substring_nametable_scan_8(match_data->code,stringname,&last,&entry);
    if (-1 < (int)match_data_local._4_4_) {
      n = 0xffffffca;
      for (_entrysize = last; _entrysize <= entry;
          _entrysize = _entrysize + (int)match_data_local._4_4_) {
        uVar1 = CONCAT11(*_entrysize,_entrysize[1]);
        if ((uint)uVar1 < (uint)*(ushort *)(stringname_local + 0x62)) {
          if (*(long *)(stringname_local + (ulong)uVar1 * 0x10 + 0x68) != -1) {
            iVar2 = coda_pcre2_substring_copy_bynumber_8
                              ((pcre2_match_data_8 *)stringname_local,(uint)uVar1,
                               (PCRE2_UCHAR8 *)sizeptr_local,(size_t *)first);
            return iVar2;
          }
          n = 0xffffffc9;
        }
      }
      match_data_local._4_4_ = n;
    }
  }
  return match_data_local._4_4_;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_copy_byname(pcre2_match_data *match_data, PCRE2_SPTR stringname,
  PCRE2_UCHAR *buffer, PCRE2_SIZE *sizeptr)
{
PCRE2_SPTR first, last, entry;
int failrc, entrysize;
if (match_data->matchedby == PCRE2_MATCHEDBY_DFA_INTERPRETER)
  return PCRE2_ERROR_DFA_UFUNC;
entrysize = pcre2_substring_nametable_scan(match_data->code, stringname,
  &first, &last);
if (entrysize < 0) return entrysize;
failrc = PCRE2_ERROR_UNAVAILABLE;
for (entry = first; entry <= last; entry += entrysize)
  {
  uint32_t n = GET2(entry, 0);
  if (n < match_data->oveccount)
    {
    if (match_data->ovector[n*2] != PCRE2_UNSET)
      return pcre2_substring_copy_bynumber(match_data, n, buffer, sizeptr);
    failrc = PCRE2_ERROR_UNSET;
    }
  }
return failrc;
}